

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O0

int dlep_reader_ipv4_subnet_tlv
              (netaddr *ipv4,_Bool *add,dlep_session *session,dlep_parser_value *value)

{
  byte *pbVar1;
  uint8_t *ptr;
  dlep_parser_value *value_local;
  dlep_session *session_local;
  _Bool *add_local;
  netaddr *ipv4_local;
  
  ptr = (uint8_t *)value;
  if ((value == (dlep_parser_value *)0x0) &&
     (ptr = (uint8_t *)dlep_session_get_tlv_value(session,10),
     (dlep_parser_value *)ptr == (dlep_parser_value *)0x0)) {
    ipv4_local._4_4_ = -1;
  }
  else {
    pbVar1 = (session->parser).tlv_ptr + *(ushort *)(ptr + 4);
    *add = (*pbVar1 & 1) == 1;
    ipv4_local._4_4_ = netaddr_from_binary_prefix(ipv4,pbVar1 + 1,4,2,pbVar1[5]);
  }
  return ipv4_local._4_4_;
}

Assistant:

int
dlep_reader_ipv4_subnet_tlv(
  struct netaddr *ipv4, bool *add, struct dlep_session *session, struct dlep_parser_value *value) {
  const uint8_t *ptr;

  if (!value) {
    value = dlep_session_get_tlv_value(session, DLEP_IPV4_SUBNET_TLV);
    if (!value) {
      return -1;
    }
  }

  ptr = dlep_session_get_tlv_binary(session, value);
  *add = (ptr[0] & DLEP_IP_ADD) == DLEP_IP_ADD;
  return netaddr_from_binary_prefix(ipv4, &ptr[1], 4, AF_INET, ptr[5]);
}